

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

HeapType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::pickSubAny
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  uint32_t uVar1;
  BasicHeapType BVar2;
  Shareability share_local;
  HeapTypeGeneratorImpl *this_local;
  
  uVar1 = Random::upTo(this->rand,8);
  if (uVar1 == 0) {
    BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::any,share);
    HeapType::HeapType((HeapType *)&this_local,BVar2);
  }
  else if (uVar1 == 1) {
    BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::none,share);
    HeapType::HeapType((HeapType *)&this_local,BVar2);
  }
  else {
    this_local = (HeapTypeGeneratorImpl *)pickSubEq(this,share);
  }
  return (HeapType)(uintptr_t)this_local;
}

Assistant:

HeapType pickSubAny(Shareability share) {
    switch (rand.upTo(8)) {
      case 0:
        return HeapTypes::any.getBasic(share);
      case 1:
        return HeapTypes::none.getBasic(share);
      default:
        return pickSubEq(share);
    }
    WASM_UNREACHABLE("unexpected index");
  }